

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_ObjCreate(Wlc_Ntk_t *p,int Type,int Signed,int End,int Beg,Vec_Int_t *vFanins)

{
  int Id;
  Wlc_Obj_t *pObj;
  int iFaninNew;
  Vec_Int_t *vFanins_local;
  int Beg_local;
  int End_local;
  int Signed_local;
  int Type_local;
  Wlc_Ntk_t *p_local;
  
  Id = Wlc_ObjAlloc(p,Type,Signed,End,Beg);
  pObj = Wlc_NtkObj(p,Id);
  Wlc_ObjAddFanins(p,pObj,vFanins);
  return Id;
}

Assistant:

int Wlc_ObjCreate( Wlc_Ntk_t * p, int Type, int Signed, int End, int Beg, Vec_Int_t * vFanins )
{
    int iFaninNew = Wlc_ObjAlloc( p, Type, Signed, End, Beg );
    Wlc_ObjAddFanins( p, Wlc_NtkObj(p, iFaninNew), vFanins );
    return iFaninNew;
}